

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O2

int __thiscall
ProgramStreamDemuxer::simpleDemuxBlock
          (ProgramStreamDemuxer *this,DemuxedData *demuxedData,PIDSet *acceptedPIDs,
          int64_t *discardSize)

{
  ushort uVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  PESPacket *this_00;
  const_iterator cVar5;
  int64_t iVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  undefined4 *puVar10;
  ushort uVar12;
  long lVar11;
  ushort uVar14;
  uint8_t *puVar13;
  long *plVar15;
  uint uVar16;
  uint uVar17;
  uint32_t uVar18;
  uint uVar19;
  uint8_t *puVar20;
  uint8_t *puVar21;
  bool bVar22;
  int startcode;
  uint32_t readedBytes;
  int afterPesHeader;
  uint8_t *local_220;
  map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_> *local_218;
  long *local_210;
  ProgramStreamDemuxer *local_208;
  int readRez;
  DemuxedData *local_1f8;
  MemoryBlock *local_1f0;
  _Base_ptr local_1e8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *local_1e0;
  _Base_ptr local_1d8;
  PESPacket *local_1d0;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream ss;
  
  *discardSize = 0;
  readedBytes = 0;
  readRez = 0;
  iVar3 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,&readedBytes,&readRez,0);
  if (readRez == 2) {
    this->m_lastReadRez = 2;
    iVar3 = 2;
  }
  else {
    uVar19 = this->m_tmpBufferLen;
    if ((readedBytes + uVar19 == 0) || ((readedBytes == 0 && (this->m_lastReadRez == 1)))) {
      this->m_lastReadRez = readRez;
      iVar3 = 1;
    }
    else {
      if (readedBytes != 0) {
        (*this->m_bufferedReader->_vptr_AbstractReader[5])
                  (this->m_bufferedReader,(ulong)(uint)this->m_readerID);
        uVar19 = this->m_tmpBufferLen;
      }
      this->m_lastReadRez = readRez;
      if (0x3fa < uVar19) {
        __assert_fail("m_tmpBufferLen <= MAX_PES_HEADER_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/programStreamDemuxer.cpp"
                      ,0xda,
                      "virtual int ProgramStreamDemuxer::simpleDemuxBlock(DemuxedData &, const PIDSet &, int64_t &)"
                     );
      }
      puVar20 = (uint8_t *)(CONCAT44(extraout_var,iVar3) + 0x3fa);
      local_210 = discardSize;
      local_1f8 = demuxedData;
      if (uVar19 != 0) {
        memcpy(puVar20 + -(ulong)uVar19,this->m_tmpBuffer,(ulong)uVar19);
        puVar20 = puVar20 + -(ulong)this->m_tmpBufferLen;
        readedBytes = readedBytes + this->m_tmpBufferLen;
        this->m_tmpBufferLen = 0;
      }
      uVar18 = readedBytes;
      uVar19 = this->m_lastPesLen;
      puVar21 = puVar20;
      if (uVar19 != 0) {
        uVar16 = uVar19;
        if (readedBytes < uVar19) {
          uVar16 = readedBytes;
        }
        local_220 = puVar20;
        if (this->m_lastPID < 1) {
          *local_210 = *local_210 + (long)(int)uVar16;
        }
        else {
          pmVar4 = std::
                   map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                   ::operator[](local_1f8,&this->m_lastPID);
          MemoryBlock::append(pmVar4,local_220,(long)(int)uVar16);
          this->m_dataProcessed = this->m_dataProcessed + (long)(int)uVar16;
          uVar19 = this->m_lastPesLen;
        }
        this->m_lastPesLen = uVar19 - uVar16;
        if (uVar19 - uVar16 != 0) {
          return (uint)(readedBytes == 0);
        }
        puVar20 = local_220 + (int)uVar16;
        puVar21 = local_220;
      }
      puVar21 = puVar21 + uVar18;
      this_00 = (PESPacket *)MPEGHeader::findNextMarker(puVar20,puVar21);
      puVar20 = (uint8_t *)((long)this_00 + (*local_210 - (long)puVar20));
      *local_210 = (long)puVar20;
      local_1d0 = (PESPacket *)(puVar21 + -9);
      local_1d8 = &(acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header._M_header;
      local_218 = &this->m_firstPtsTime;
      local_1e8 = &(this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_1f0 = this->m_lpcmWaveHeader;
      plVar15 = local_210;
      local_220 = puVar21;
      local_208 = this;
      local_1e0 = &acceptedPIDs->_M_t;
      while (this_00 <= local_1d0) {
        bVar2 = this_00->m_streamID;
        startcode = (int)bVar2;
        bVar22 = (bVar2 & 0xbf) != 0xbd;
        if (0x30 < (byte)(bVar2 + 0x41) && bVar22) {
          if (bVar2 == 0xbc) {
            uVar19 = mpegps_psm_parse(this,&this_00->startCode0,puVar21);
            if (uVar19 == 0xffffffff) break;
            uVar9 = (ulong)uVar19;
            lVar11 = (long)puVar21 - (long)this_00;
            if (lVar11 < (long)uVar9) {
              *plVar15 = *plVar15 + lVar11;
              this->m_lastPID = 0;
              this->m_lastPesLen = uVar19 - (int)lVar11;
              return 0;
            }
            *plVar15 = *plVar15 + uVar9;
            puVar13 = &this_00->startCode0 + uVar9;
          }
          else {
            lVar11 = (long)puVar21 - (long)this_00;
            if (3 < (long)puVar21 - (long)this_00) {
              lVar11 = 4;
            }
            puVar13 = &this_00->startCode0 + lVar11;
            *plVar15 = (long)(puVar20 + lVar11);
          }
        }
        else {
          if (puVar21 < &this_00->m_pesPacketLenHi + (byte)(this_00->m_pesHeaderLen + 9)) break;
          afterPesHeader = 0;
          startcode = processPES(this,&this_00->startCode0,(uint8_t *)(ulong)bVar22,&afterPesHeader)
          ;
          cVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::find(&acceptedPIDs->_M_t,&startcode);
          if (cVar5._M_node == local_1d8) {
            uVar14._0_1_ = this_00->m_pesPacketLenHi;
            uVar14._1_1_ = this_00->m_pesPacketLenLo;
            uVar12 = uVar14 << 8 | uVar14 >> 8;
            uVar14 = uVar12 + 6;
            if (uVar12 == 0) {
              uVar14 = 0;
            }
            uVar9 = (ulong)uVar14;
            lVar11 = (long)puVar21 - (long)this_00;
            if (lVar11 < (long)uVar9) {
              *plVar15 = *plVar15 + lVar11;
              this->m_lastPID = 0;
              this->m_lastPesLen = (uint)uVar14 - (int)lVar11;
              return 0;
            }
            *plVar15 = *plVar15 + uVar9;
          }
          else {
            if ((char)this_00->flagsLo < '\0') {
              iVar6 = PESPacket::getPts(this_00);
              if ((this->m_firstPTS == -1) || (iVar6 < this->m_firstPTS)) {
                this->m_firstPTS = iVar6;
              }
              bVar22 = isVideoPID(this,startcode);
              if ((bVar22) && ((this->m_firstVideoPTS == -1 || (iVar6 < this->m_firstVideoPTS)))) {
                this->m_firstVideoPTS = iVar6;
              }
              iVar7 = std::
                      _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                      ::find(&local_218->_M_t,&startcode);
              if ((iVar7._M_node == local_1e8) ||
                 (pmVar8 = std::
                           map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                           ::operator[](local_218,&startcode), iVar6 < *pmVar8)) {
                pmVar8 = std::
                         map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                         ::operator[](local_218,&startcode);
                *pmVar8 = iVar6;
              }
            }
            pmVar4 = std::
                     map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                     ::operator[](local_1f8,&startcode);
            if (((startcode & 0xfffffff0U) == 0xa0) &&
               (uVar19 = startcode - 0xa0, this->m_lpcpHeaderAdded[uVar19] == false)) {
              puVar20 = local_1f0[uVar19].m_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar13 = (uint8_t *)0x0;
              if (puVar20 !=
                  local_1f0[uVar19].m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                puVar13 = puVar20;
              }
              MemoryBlock::append(pmVar4,puVar13,local_1f0[uVar19].m_size);
              this->m_lpcpHeaderAdded[uVar19] = true;
            }
            bVar2 = this_00->m_pesHeaderLen + 9;
            puVar20 = &this_00->startCode0 + (ulong)bVar2 + (long)afterPesHeader;
            uVar12._0_1_ = this_00->m_pesPacketLenHi;
            uVar12._1_1_ = this_00->m_pesPacketLenLo;
            uVar12 = uVar12 << 8 | uVar12 >> 8;
            uVar14 = uVar12 + 6;
            if (uVar12 == 0) {
              uVar14 = 0;
            }
            uVar16 = (uint)uVar14 - ((uint)bVar2 + afterPesHeader);
            uVar17 = (int)puVar21 - (int)puVar20;
            uVar19 = uVar17;
            if ((int)uVar16 < (int)uVar17) {
              uVar19 = uVar16;
            }
            if ((int)uVar19 < 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
              std::operator<<((ostream *)&ss,"Invalid copyLen");
              puVar10 = (undefined4 *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              *puVar10 = 3;
              *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
              if (local_1c8 == &local_1b8) {
                puVar10[6] = local_1b8;
                puVar10[7] = uStack_1b4;
                puVar10[8] = uStack_1b0;
                puVar10[9] = uStack_1ac;
              }
              else {
                *(uint **)(puVar10 + 2) = local_1c8;
                *(ulong *)(puVar10 + 6) = CONCAT44(uStack_1b4,local_1b8);
              }
              *(undefined8 *)(puVar10 + 4) = local_1c0;
              local_1c0 = 0;
              local_1b8 = local_1b8 & 0xffffff00;
              local_1c8 = &local_1b8;
              __cxa_throw(puVar10,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            MemoryBlock::append(pmVar4,puVar20,(ulong)uVar19);
            local_208->m_dataProcessed = local_208->m_dataProcessed + (ulong)uVar19;
            *local_210 = (long)(puVar20 + (*local_210 - (long)this_00));
            if ((int)uVar17 < (int)uVar16) {
              local_208->m_lastPesLen = uVar16 - uVar19;
              local_208->m_lastPID = startcode;
              return 0;
            }
            uVar1._0_1_ = this_00->m_pesPacketLenHi;
            uVar1._1_1_ = this_00->m_pesPacketLenLo;
            uVar12 = uVar1 << 8 | uVar1 >> 8;
            uVar14 = uVar12 + 6;
            if (uVar12 == 0) {
              uVar14 = 0;
            }
            uVar9 = (ulong)uVar14;
            this = local_208;
            plVar15 = local_210;
            acceptedPIDs = (PIDSet *)local_1e0;
            puVar21 = local_220;
          }
          puVar13 = &this_00->startCode0 + uVar9;
        }
        this_00 = (PESPacket *)MPEGHeader::findNextMarker(puVar13,puVar21);
        puVar20 = (uint8_t *)((long)this_00 + (*plVar15 - (long)puVar13));
        *plVar15 = (long)puVar20;
      }
      uVar18 = (uint32_t)((long)puVar21 - (long)this_00);
      this->m_tmpBufferLen = uVar18;
      iVar3 = 0;
      if (uVar18 != 0) {
        memmove(this->m_tmpBuffer,this_00,(long)puVar21 - (long)this_00);
      }
    }
  }
  return iVar3;
}

Assistant:

int ProgramStreamDemuxer::simpleDemuxBlock(DemuxedData& demuxedData, const PIDSet& acceptedPIDs, int64_t& discardSize)
{
    discardSize = 0;
    uint32_t readedBytes = 0;
    int readRez = 0;
    uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez);  // blocked read mode
    if (readRez == BufferedFileReader::DATA_NOT_READY)
    {
        m_lastReadRez = readRez;
        return BufferedFileReader::DATA_NOT_READY;
    }
    if (readedBytes + m_tmpBufferLen == 0 || (readedBytes == 0 && m_lastReadRez == BufferedReader::DATA_EOF))
    {
        m_lastReadRez = readRez;
        return BufferedReader::DATA_EOF;
    }
    if (readedBytes > 0)
        m_bufferedReader->notify(m_readerID, readedBytes);

    m_lastReadRez = readRez;
    data += MAX_PES_HEADER_SIZE;
    assert(m_tmpBufferLen <= MAX_PES_HEADER_SIZE);
    if (m_tmpBufferLen > 0)
    {
        memcpy(data - m_tmpBufferLen, m_tmpBuffer, m_tmpBufferLen);
        data -= m_tmpBufferLen;
        readedBytes += m_tmpBufferLen;
        m_tmpBufferLen = 0;
    }

    uint8_t* end = data + readedBytes;
    uint8_t* curBuf = data;

    if (m_lastPesLen > 0)
    {
        const int copyLen = FFMIN(readedBytes, m_lastPesLen);
        if (m_lastPID > 0)
        {
            StreamData& vect = demuxedData[m_lastPID];
            vect.append(curBuf, copyLen);
            m_dataProcessed += copyLen;
        }
        else
            discardSize += copyLen;
        curBuf += copyLen;
        m_lastPesLen -= copyLen;
        if (m_lastPesLen > 0)
        {
            if (readedBytes > 0)
                return 0;
            return BufferedReader::DATA_EOF;
        }
    }

    const uint8_t* prevBuf = curBuf;
    curBuf = MPEGHeader::findNextMarker(curBuf, end);
    discardSize += curBuf - prevBuf;

    while (curBuf <= end - 9)
    {
        const auto pesPacket = reinterpret_cast<PESPacket*>(curBuf);
        int startcode = curBuf[3];
        if ((startcode >= 0xc0 && startcode <= 0xef) || (startcode == PES_PRIVATE_DATA1) || (startcode == PES_VC1_ID) ||
            (startcode == PES_PRIVATE_DATA2))
        {
            if (curBuf + pesPacket->getHeaderLength() + 4 > end)
                break;
            int afterPesHeader = 0;
            startcode = processPES(curBuf, end, afterPesHeader);
            if (acceptedPIDs.find(startcode) != acceptedPIDs.end())
            {
                if ((pesPacket->flagsLo & 0x80) == 0x80)
                {
                    const int64_t curPts = pesPacket->getPts();
                    if (m_firstPTS == -1 || curPts < m_firstPTS)
                        m_firstPTS = curPts;
                    if (isVideoPID(startcode) && (m_firstVideoPTS == -1 || curPts < m_firstVideoPTS))
                        m_firstVideoPTS = curPts;
                    if (m_firstPtsTime.find(startcode) == m_firstPtsTime.end() || curPts < m_firstPtsTime[startcode])
                        m_firstPtsTime[startcode] = curPts;
                }

                StreamData& vect = demuxedData[startcode];

                const int idx = startcode - 0xa0;
                if (idx >= 0 && idx <= 15 && !m_lpcpHeaderAdded[idx])
                {
                    vect.append(m_lpcmWaveHeader[idx].data(), m_lpcmWaveHeader[idx].size());
                    m_lpcpHeaderAdded[idx] = true;
                }

                const uint8_t* payloadData = curBuf + pesPacket->getHeaderLength() + afterPesHeader;
                const int pesPayloadLen = pesPacket->getPacketLength() - pesPacket->getHeaderLength() - afterPesHeader;
                const int copyLen = FFMIN(pesPayloadLen, (int)(end - payloadData));
                if (copyLen < 0)
                {
                    THROW(ERR_COMMON, "Invalid copyLen")
                }
                vect.append(payloadData, copyLen);
                m_dataProcessed += copyLen;
                discardSize += payloadData - curBuf;
                if (copyLen < pesPayloadLen)
                {
                    m_lastPesLen = pesPayloadLen - copyLen;
                    m_lastPID = startcode;
                    return 0;
                }
                curBuf += pesPacket->getPacketLength();
            }
            else
            {
                const int tmpLen = pesPacket->getPacketLength();
                if (tmpLen > end - curBuf)
                {
                    discardSize += end - curBuf;
                    m_lastPID = 0;
                    m_lastPesLen = tmpLen - static_cast<int>(end - curBuf);
                    return 0;
                }
                curBuf += tmpLen;
                discardSize += tmpLen;
            }
        }
        else if (startcode == PES_PROGRAM_STREAM_MAP)
        {
            const int psmLen = mpegps_psm_parse(curBuf, end);
            if (psmLen == -1)
                break;
            if (psmLen > end - curBuf)
            {
                discardSize += end - curBuf;
                m_lastPID = 0;
                m_lastPesLen = psmLen - static_cast<int>(end - curBuf);
                return 0;
            }
            discardSize += psmLen;
            curBuf += psmLen;
        }
        else
        {
            const int64_t rest = FFMIN(end - curBuf, 4);
            curBuf += rest;
            discardSize += rest;
        }
        prevBuf = curBuf;
        curBuf = MPEGHeader::findNextMarker(curBuf, end);
        discardSize += curBuf - prevBuf;
    }
    m_tmpBufferLen = static_cast<uint32_t>(end - curBuf);
    if (m_tmpBufferLen > 0)
        memmove(m_tmpBuffer, curBuf, end - curBuf);
    return 0;
}